

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_conversion.cpp
# Opt level: O0

bool crnlib::texture_conversion::process(convert_params *params,convert_stats *stats)

{
  bool bVar1;
  component_flags cVar2;
  int iVar3;
  pixel_format pVar4;
  mipmapped_texture *pmVar5;
  char *pcVar6;
  char *pcVar7;
  dynamic_string *pdVar8;
  undefined1 local_488 [8];
  dynamic_string str;
  double total_write_time;
  timer t;
  bool local_450;
  bool local_44f;
  bool local_44e;
  pixel_format pStack_44c;
  bool status;
  bool formats_differ;
  bool generate_mipmaps;
  bool perceptual;
  bool is_normal_map;
  pixel_format dst_format;
  undefined1 local_409;
  mipmapped_texture *pmStack_408;
  bool bOutputFormatSupportsFlippedTextures;
  mipmapped_texture *work_tex;
  progress_params progress_state;
  crn_mipmap_params mipmap_params;
  crn_comp_params comp_params;
  texture_type tex_type;
  convert_stats *stats_local;
  convert_params *params_local;
  
  comp_params.m_pProgress_func_data._4_4_ = params->m_texture_type;
  memcpy(&mipmap_params.m_clamp_width,&params->m_comp_params,0x378);
  pmVar5 = (mipmapped_texture *)&params->m_mipmap_params;
  memcpy(&progress_state.m_start_percentage,pmVar5,0x50);
  progress_state.m_pParams._4_1_ = 0;
  progress_state.m_pParams._0_4_ = 0;
  params->m_status = false;
  work_tex = (mipmapped_texture *)params;
  dynamic_string::clear(&params->m_error_message);
  if (params->m_pIntermediate_texture != (mipmapped_texture *)0x0) {
    crnlib_delete<crnlib::mipmapped_texture>(params->m_pIntermediate_texture);
    params->m_pIntermediate_texture = (mipmapped_texture *)0x0;
  }
  pmVar5 = crnlib_new<crnlib::mipmapped_texture,crnlib::mipmapped_texture>
                     ((crnlib *)params->m_pInput_texture,pmVar5);
  params->m_pIntermediate_texture = pmVar5;
  pmStack_408 = params->m_pInput_texture;
  if (((params->m_unflip & 1U) != 0) && (bVar1 = mipmapped_texture::is_flipped(pmStack_408), bVar1))
  {
    console::info("Unflipping texture");
    mipmapped_texture::unflip(pmStack_408,true,true);
  }
  if ((params->m_y_flip & 1U) != 0) {
    console::info("Flipping texture on Y axis");
    local_409 = params->m_dst_file_type == cFormatKTX;
    bVar1 = mipmapped_texture::flip_y(pmStack_408,(bool)local_409);
    if (!bVar1) {
      console::warning("Failed flipping texture on Y axis");
    }
  }
  if (((params->m_dst_format != PIXEL_FMT_INVALID) &&
      (bVar1 = pixel_format_helpers::is_alpha_only(params->m_dst_format), bVar1)) &&
     (cVar2 = mipmapped_texture::get_comp_flags(pmStack_408), (cVar2 & cCompFlagAValid) == 0)) {
    console::warning(
                    "Output format is alpha-only, but input doesn\'t have alpha, so setting alpha to luminance."
                    );
    pmVar5 = pmStack_408;
    dxt_image::pack_params::pack_params((pack_params *)&formats_differ);
    mipmapped_texture::convert(pmVar5,PIXEL_FMT_A8,(pack_params *)&formats_differ);
    if (comp_params.m_pProgress_func_data._4_4_ == cTextureTypeNormalMap) {
      comp_params.m_pProgress_func_data._4_4_ = cTextureTypeRegularMap;
    }
  }
  pStack_44c = params->m_dst_format;
  iVar3 = pixel_format_helpers::is_dxt(pStack_44c);
  if (((iVar3 != 0) && (params->m_dst_file_type != cFormatCRN)) &&
     ((params->m_dst_file_type != cFormatDDS && (params->m_dst_file_type != cFormatKTX)))) {
    console::warning(
                    "Output file format does not support DXTc - automatically choosing a non-DXT pixel format."
                    );
    pStack_44c = PIXEL_FMT_INVALID;
  }
  if (pStack_44c == PIXEL_FMT_INVALID) {
    pStack_44c = choose_pixel_format(params,(crn_comp_params *)&mipmap_params.m_clamp_width,
                                     pmStack_408,comp_params.m_pProgress_func_data._4_4_);
  }
  if ((pStack_44c == PIXEL_FMT_DXT1) &&
     (bVar1 = crn_comp_params::get_flag
                        ((crn_comp_params *)&mipmap_params.m_clamp_width,
                         cCRNCompFlagDXT1AForTransparency), bVar1)) {
    pStack_44c = PIXEL_FMT_DXT1A;
  }
  else if (pStack_44c == PIXEL_FMT_DXT1A) {
    crn_comp_params::set_flag
              ((crn_comp_params *)&mipmap_params.m_clamp_width,cCRNCompFlagDXT1AForTransparency,true
              );
  }
  if ((pStack_44c == PIXEL_FMT_DXT1A) && (params->m_dst_file_type == cFormatCRN)) {
    console::warning(
                    "CRN file format does not support DXT1A compressed textures - converting to DXT5 instead."
                    );
    pStack_44c = PIXEL_FMT_DXT5;
  }
  local_44e = crn_comp_params::get_flag
                        ((crn_comp_params *)&mipmap_params.m_clamp_width,cCRNCompFlagPerceptual);
  if (comp_params.m_pProgress_func_data._4_4_ == cTextureTypeNormalMap) {
    local_44e = false;
    mipmap_params.m_mode = cCRNMipModeUseSourceOrGenerateMips;
  }
  bVar1 = pixel_format_helpers::is_pixel_format_non_srgb(pStack_44c);
  if ((bVar1) && (local_44e != false)) {
    console::message(
                    "Output pixel format is swizzled or not RGB, disabling perceptual color metrics"
                    );
    local_44e = false;
  }
  bVar1 = pixel_format_helpers::is_normal_map(pStack_44c);
  if (bVar1) {
    if (local_44e != false) {
      console::message(
                      "Output pixel format is intended for normal maps, disabling perceptual color metrics"
                      );
    }
    local_44e = false;
  }
  local_44f = texture_file_types::supports_mipmaps(params->m_dst_file_type);
  if (((((params->m_write_mipmaps_to_multiple_files & 1U) != 0) &&
       (params->m_dst_file_type != cFormatCRN)) && (params->m_dst_file_type != cFormatDDS)) &&
     (params->m_dst_file_type != cFormatKTX)) {
    local_44f = true;
  }
  if ((params->m_param_debugging & 1U) != 0) {
    convert_params::print(params);
    print_comp_params((crn_comp_params *)&mipmap_params.m_clamp_width);
    print_mipmap_params((crn_mipmap_params *)&progress_state.m_start_percentage);
  }
  bVar1 = create_texture_mipmaps
                    (pmStack_408,(crn_comp_params *)&mipmap_params.m_clamp_width,
                     (crn_mipmap_params *)&progress_state.m_start_percentage,local_44f);
  if (bVar1) {
    pVar4 = mipmapped_texture::get_format(pmStack_408);
    local_450 = pVar4 != pStack_44c;
    if (local_450) {
      pVar4 = mipmapped_texture::get_format(pmStack_408);
      bVar1 = pixel_format_helpers::is_dxt1(pVar4);
      if ((bVar1) && (bVar1 = pixel_format_helpers::is_dxt1(pStack_44c), bVar1)) {
        local_450 = false;
      }
    }
    t._23_1_ = 0;
    timer::timer((timer *)&total_write_time);
    timer::start((timer *)&total_write_time);
    if ((params->m_dst_file_type == cFormatCRN) ||
       (((params->m_dst_file_type == cFormatDDS &&
         (iVar3 = pixel_format_helpers::is_dxt(pStack_44c), iVar3 != 0)) &&
        ((0.0 < comp_params.m_pImages[5][0xf]._0_4_ || (comp_params.m_pImages[5][0xf]._4_4_ < 0xff))
        )))) {
      t._23_1_ = write_compressed_texture
                           (pmStack_408,params,(crn_comp_params *)&mipmap_params.m_clamp_width,
                            pStack_44c,(progress_params *)&work_tex,local_44e,stats);
    }
    else {
      if ((0.0 < comp_params.m_pImages[5][0xf]._0_4_) ||
         (comp_params.m_pImages[5][0xf]._4_4_ < 0xff)) {
        console::warning(
                        "Target bitrate/quality level is not supported for this output file format.\n"
                        );
      }
      t._23_1_ = convert_and_write_normal_texture
                           (pmStack_408,params,(crn_comp_params *)&mipmap_params.m_clamp_width,
                            pStack_44c,(progress_params *)&work_tex,local_450,local_44e,stats);
    }
    console::progress("");
    if ((progress_state.m_pParams._4_1_ & 1) == 0) {
      str.m_pStr = (char *)timer::get_elapsed_secs((timer *)&total_write_time);
      if ((t._23_1_ & 1) == 0) {
        dynamic_string::dynamic_string((dynamic_string *)local_488);
        pdVar8 = mipmapped_texture::get_last_error(pmStack_408);
        bVar1 = dynamic_string::is_empty(pdVar8);
        if (bVar1) {
          pcVar6 = dynamic_string::get_ptr(&params->m_dst_filename);
          dynamic_string::format
                    ((dynamic_string *)local_488,"Failed writing texture to file \"%s\"",pcVar6);
        }
        else {
          pcVar6 = dynamic_string::get_ptr(&params->m_dst_filename);
          pdVar8 = mipmapped_texture::get_last_error(pmStack_408);
          pcVar7 = dynamic_string::get_ptr(pdVar8);
          dynamic_string::format
                    ((dynamic_string *)local_488,"Failed writing texture to file \"%s\", Reason: %s"
                     ,pcVar6,pcVar7);
        }
        pcVar6 = dynamic_string::get_ptr((dynamic_string *)local_488);
        params_local._7_1_ = convert_error(params,pcVar6);
        dynamic_string::~dynamic_string((dynamic_string *)local_488);
      }
      else {
        if ((params->m_param_debugging & 1U) != 0) {
          pVar4 = mipmapped_texture::get_format(pmStack_408);
          pcVar6 = pixel_format_helpers::get_pixel_format_string(pVar4);
          pcVar7 = pixel_format_helpers::get_pixel_format_string(pStack_44c);
          console::info("Work texture format: %s, desired destination format: %s",pcVar6,pcVar7);
        }
        console::message("Texture successfully written in %3.3fs",str.m_pStr);
        if ((params->m_debugging & 1U) != 0) {
          crnlib_print_mem_stats();
        }
        params->m_status = true;
        params_local._7_1_ = true;
      }
    }
    else {
      params->m_canceled = true;
      params_local._7_1_ = false;
    }
  }
  else {
    params_local._7_1_ = convert_error(params,"Failed creating texture mipmaps!");
  }
  return params_local._7_1_;
}

Assistant:

bool process(convert_params& params, convert_stats& stats) {
  texture_type tex_type = params.m_texture_type;

  crn_comp_params comp_params(params.m_comp_params);
  crn_mipmap_params mipmap_params(params.m_mipmap_params);

  progress_params progress_state;
  progress_state.m_pParams = &params;
  progress_state.m_canceled = false;
  progress_state.m_start_percentage = 0;

  params.m_status = false;
  params.m_error_message.clear();

  if (params.m_pIntermediate_texture) {
    crnlib_delete(params.m_pIntermediate_texture);
    params.m_pIntermediate_texture = NULL;
  }

  params.m_pIntermediate_texture = crnlib_new<mipmapped_texture>(*params.m_pInput_texture);

  mipmapped_texture& work_tex = *params.m_pInput_texture;

  if ((params.m_unflip) && (work_tex.is_flipped())) {
    console::info("Unflipping texture");
    work_tex.unflip(true, true);
  }

  if (params.m_y_flip) {
    console::info("Flipping texture on Y axis");

    // This is awkward - if we're writing to KTX, then go ahead and properly update the work texture's orientation flags.
    // Otherwise, don't bother updating the orientation flags because the writer may then attempt to unflip the texture before writing to formats
    // that don't support flipped textures (ugh).
    const bool bOutputFormatSupportsFlippedTextures = params.m_dst_file_type == texture_file_types::cFormatKTX;
    if (!work_tex.flip_y(bOutputFormatSupportsFlippedTextures)) {
      console::warning("Failed flipping texture on Y axis");
    }
  }

  if ((params.m_dst_format != PIXEL_FMT_INVALID) && (pixel_format_helpers::is_alpha_only(params.m_dst_format))) {
    if ((work_tex.get_comp_flags() & pixel_format_helpers::cCompFlagAValid) == 0) {
      console::warning("Output format is alpha-only, but input doesn't have alpha, so setting alpha to luminance.");

      work_tex.convert(PIXEL_FMT_A8, crnlib::dxt_image::pack_params());

      if (tex_type == cTextureTypeNormalMap)
        tex_type = cTextureTypeRegularMap;
    }
  }

  pixel_format dst_format = params.m_dst_format;
  if (pixel_format_helpers::is_dxt(dst_format)) {
    if ((params.m_dst_file_type != texture_file_types::cFormatCRN) &&
        (params.m_dst_file_type != texture_file_types::cFormatDDS) &&
        (params.m_dst_file_type != texture_file_types::cFormatKTX)) {
      console::warning("Output file format does not support DXTc - automatically choosing a non-DXT pixel format.");
      dst_format = PIXEL_FMT_INVALID;
    }
  }

  if (dst_format == PIXEL_FMT_INVALID) {
    // Caller didn't specify a format to use, so try to pick something reasonable.
    // This is actually much trickier than it seems, and the current approach kind of sucks.
    dst_format = choose_pixel_format(params, comp_params, work_tex, tex_type);
  }

  if ((dst_format == PIXEL_FMT_DXT1) && (comp_params.get_flag(cCRNCompFlagDXT1AForTransparency)))
    dst_format = PIXEL_FMT_DXT1A;
  else if (dst_format == PIXEL_FMT_DXT1A)
    comp_params.set_flag(cCRNCompFlagDXT1AForTransparency, true);

  if ((dst_format == PIXEL_FMT_DXT1A) && (params.m_dst_file_type == texture_file_types::cFormatCRN)) {
    console::warning("CRN file format does not support DXT1A compressed textures - converting to DXT5 instead.");
    dst_format = PIXEL_FMT_DXT5;
  }

  const bool is_normal_map = (tex_type == cTextureTypeNormalMap);
  bool perceptual = comp_params.get_flag(cCRNCompFlagPerceptual);
  if (is_normal_map) {
    perceptual = false;
    mipmap_params.m_gamma_filtering = false;
  }

  if (pixel_format_helpers::is_pixel_format_non_srgb(dst_format)) {
    if (perceptual) {
      console::message("Output pixel format is swizzled or not RGB, disabling perceptual color metrics");
      perceptual = false;
    }
  }

  if (pixel_format_helpers::is_normal_map(dst_format)) {
    if (perceptual)
      console::message("Output pixel format is intended for normal maps, disabling perceptual color metrics");

    perceptual = false;
  }

  bool generate_mipmaps = texture_file_types::supports_mipmaps(params.m_dst_file_type);
  if ((params.m_write_mipmaps_to_multiple_files) &&
      ((params.m_dst_file_type != texture_file_types::cFormatCRN) && (params.m_dst_file_type != texture_file_types::cFormatDDS) && (params.m_dst_file_type != texture_file_types::cFormatKTX))) {
    generate_mipmaps = true;
  }

  if (params.m_param_debugging) {
    params.print();

    print_comp_params(comp_params);
    print_mipmap_params(mipmap_params);
  }

  if (!create_texture_mipmaps(work_tex, comp_params, mipmap_params, generate_mipmaps))
    return convert_error(params, "Failed creating texture mipmaps!");

  bool formats_differ = work_tex.get_format() != dst_format;
  if (formats_differ) {
    if (pixel_format_helpers::is_dxt1(work_tex.get_format()) && pixel_format_helpers::is_dxt1(dst_format))
      formats_differ = false;
  }

  bool status = false;

  timer t;
  t.start();

  if ((params.m_dst_file_type == texture_file_types::cFormatCRN) ||
      ((params.m_dst_file_type == texture_file_types::cFormatDDS) && (pixel_format_helpers::is_dxt(dst_format)) &&
       //((formats_differ) || (comp_params.m_target_bitrate > 0.0f) || (comp_params.m_quality_level < cCRNMaxQualityLevel))
       ((comp_params.m_target_bitrate > 0.0f) || (comp_params.m_quality_level < cCRNMaxQualityLevel)))) {
    status = write_compressed_texture(work_tex, params, comp_params, dst_format, progress_state, perceptual, stats);
  } else {
    if ((comp_params.m_target_bitrate > 0.0f) || (comp_params.m_quality_level < cCRNMaxQualityLevel)) {
      console::warning("Target bitrate/quality level is not supported for this output file format.\n");
    }
    status = convert_and_write_normal_texture(work_tex, params, comp_params, dst_format, progress_state, formats_differ, perceptual, stats);
  }

  console::progress("");

  if (progress_state.m_canceled) {
    params.m_canceled = true;
    return false;
  }

  double total_write_time = t.get_elapsed_secs();

  if (status) {
    if (params.m_param_debugging)
      console::info("Work texture format: %s, desired destination format: %s", pixel_format_helpers::get_pixel_format_string(work_tex.get_format()), pixel_format_helpers::get_pixel_format_string(dst_format));

    console::message("Texture successfully written in %3.3fs", total_write_time);
  } else {
    dynamic_string str;

    if (work_tex.get_last_error().is_empty())
      str.format("Failed writing texture to file \"%s\"", params.m_dst_filename.get_ptr());
    else
      str.format("Failed writing texture to file \"%s\", Reason: %s", params.m_dst_filename.get_ptr(), work_tex.get_last_error().get_ptr());

    return convert_error(params, str.get_ptr());
  }

  if (params.m_debugging) {
    crnlib_print_mem_stats();
  }

  params.m_status = true;
  return true;
}